

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O1

size_t __thiscall kws::Parser::GetPositionWithComments(Parser *this,size_t pos)

{
  pointer ppVar1;
  
  for (ppVar1 = (this->m_CommentPositions).
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      (ppVar1 != (this->m_CommentPositions).
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish && (ppVar1->first <= pos));
      ppVar1 = ppVar1 + 1) {
    pos = (pos - ppVar1->first) + ppVar1->second;
  }
  return pos;
}

Assistant:

size_t Parser::GetPositionWithComments(size_t pos) const
{
  auto it = m_CommentPositions.begin();
  while(it != m_CommentPositions.end())
    {
    if((pos>=(*it).first))
      {
      pos += ((*it).second-(*it).first);
      }
    else
      {
      break;
      }
    it++;
    }
  return pos;
}